

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

unsigned_long_long
el::base::utils::DateTime::getTimeDifference
          (timeval *endTime,timeval *startTime,TimestampUnit timestampUnit)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  anon_class_1_0_00000001 local_25;
  TimestampUnit local_24;
  anon_class_1_0_00000001 conv;
  timeval *ptStack_20;
  TimestampUnit timestampUnit_local;
  timeval *startTime_local;
  timeval *endTime_local;
  
  if (timestampUnit == Microsecond) {
    endTime_local =
         (timeval *)
         ((endTime->tv_sec * 1000000 + endTime->tv_usec) -
         (startTime->tv_sec * 1000000 + startTime->tv_usec));
  }
  else {
    local_24 = timestampUnit;
    ptStack_20 = startTime;
    uVar1 = getTimeDifference::anon_class_1_0_00000001::operator()(&local_25,endTime);
    uVar2 = getTimeDifference::anon_class_1_0_00000001::operator()(&local_25,ptStack_20);
    endTime_local = (timeval *)(uVar1 - uVar2);
  }
  return (unsigned_long_long)endTime_local;
}

Assistant:

unsigned long long DateTime::getTimeDifference(const struct timeval& endTime, const struct timeval& startTime,
    base::TimestampUnit timestampUnit) {
  if (timestampUnit == base::TimestampUnit::Microsecond) {
    return static_cast<unsigned long long>(static_cast<unsigned long long>(1000000 * endTime.tv_sec + endTime.tv_usec) -
                                           static_cast<unsigned long long>(1000000 * startTime.tv_sec + startTime.tv_usec));
  }
  // milliseconds
  auto conv = [](const struct timeval& tim) {
    return static_cast<unsigned long long>((tim.tv_sec * 1000) + (tim.tv_usec / 1000));
  };
  return static_cast<unsigned long long>(conv(endTime) - conv(startTime));
}